

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O0

bool __thiscall llvm::sys::SmartMutex<false>::unlock(SmartMutex<false> *this)

{
  bool bVar1;
  SmartMutex<false> *this_local;
  
  bVar1 = MutexImpl::release(&this->impl);
  return bVar1;
}

Assistant:

bool unlock() {
        if (!mt_only || llvm_is_multithreaded()) {
          return impl.release();
        } else {
          // Single-threaded debugging code.  This would be racy in
          // multithreaded mode, but provides not sanity checks in single
          // threaded mode.
          assert(((recursive && acquired) || (acquired == 1)) &&
                 "Lock not acquired before release!");
          --acquired;
          return true;
        }
      }